

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O0

int CreateBotDist(DdNode *node,st__table *pathTable,uint *pathLengthArray,FILE *fp)

{
  int iVar1;
  uint local_88;
  int local_84;
  uint local_80;
  int processingDone;
  DdHalfWord botDist;
  uint pathLength;
  uint evenLen;
  uint oddLen;
  NodeDist_t *nodeStatChild;
  NodeDist_t *nodeStat;
  DdNode *regChild;
  DdNode *child;
  DdNode *realChild;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  FILE *fp_local;
  uint *pathLengthArray_local;
  st__table *pathTable_local;
  DdNode *node_local;
  
  if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
    node_local._4_4_ = 1;
  }
  else {
    Nv = (DdNode *)((ulong)node & 0xfffffffffffffffe);
    N = (DdNode *)fp;
    fp_local = (FILE *)pathLengthArray;
    pathLengthArray_local = (uint *)pathTable;
    pathTable_local = (st__table *)node;
    iVar1 = st__lookup(pathTable,(char *)Nv,(char **)&nodeStatChild);
    if (iVar1 == 0) {
      fprintf((FILE *)N,"Something wrong, the entry doesn\'t exist\n");
      node_local._4_4_ = 0;
    }
    else {
      if ((nodeStatChild->oddTopDist == 0xffffffff) || (nodeStatChild->oddBotDist == 0xffffffff)) {
        pathLength = 0xffffffff;
      }
      else {
        pathLength = nodeStatChild->oddTopDist + nodeStatChild->oddBotDist;
      }
      if ((nodeStatChild->evenTopDist == 0xffffffff) || (nodeStatChild->evenBotDist == 0xffffffff))
      {
        botDist = 0xffffffff;
      }
      else {
        botDist = nodeStatChild->evenTopDist + nodeStatChild->evenBotDist;
      }
      if (botDist < pathLength) {
        local_88 = botDist;
      }
      else {
        local_88 = pathLength;
      }
      processingDone = local_88;
      Nnv = *(DdNode **)(((ulong)Nv & 0xfffffffffffffffe) + 0x10);
      realChild = *(DdNode **)(((ulong)Nv & 0xfffffffffffffffe) + 0x18);
      for (local_84 = 0; local_84 != 2; local_84 = local_84 + 1) {
        if (local_84 == 0) {
          regChild = Nnv;
        }
        else {
          regChild = realChild;
        }
        child = (DdNode *)((ulong)regChild ^ (long)(int)((uint)pathTable_local & 1));
        nodeStat = (NodeDist_t *)((ulong)regChild & 0xfffffffffffffffe);
        if (*(int *)((ulong)child & 0xfffffffffffffffe) == 0x7fffffff) {
          if (((ulong)regChild & 1) == 0) {
            nodeStatChild->evenBotDist = 1;
          }
          else {
            nodeStatChild->oddBotDist = 1;
          }
        }
        else {
          iVar1 = st__lookup((st__table *)pathLengthArray_local,(char *)nodeStat,(char **)&evenLen);
          if (iVar1 == 0) {
            fprintf((FILE *)N,
                    "Something wrong, node in table should have been created in top dist proc.\n");
            return 0;
          }
          if (*(int *)(_evenLen + 8) == -1) {
            if (*(int *)(_evenLen + 0xc) != -1) {
              fprintf((FILE *)N,"Something wrong, both bot nodeStats should be there\n");
              return 0;
            }
            iVar1 = CreateBotDist(child,(st__table *)pathLengthArray_local,(uint *)fp_local,
                                  (FILE *)N);
            if (iVar1 == 0) {
              return 0;
            }
          }
          if (((ulong)regChild & 1) == 0) {
            if (*(int *)(_evenLen + 0xc) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 0xc) + 1;
            }
            if (local_80 < nodeStatChild->evenBotDist) {
              nodeStatChild->evenBotDist = local_80;
            }
            if (*(int *)(_evenLen + 8) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 8) + 1;
            }
            if (local_80 < nodeStatChild->oddBotDist) {
              nodeStatChild->oddBotDist = local_80;
            }
          }
          else {
            if (*(int *)(_evenLen + 8) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 8) + 1;
            }
            if (local_80 < nodeStatChild->evenBotDist) {
              nodeStatChild->evenBotDist = local_80;
            }
            if (*(int *)(_evenLen + 0xc) == -1) {
              local_80 = 0xffffffff;
            }
            else {
              local_80 = *(int *)(_evenLen + 0xc) + 1;
            }
            if (local_80 < nodeStatChild->oddBotDist) {
              nodeStatChild->oddBotDist = local_80;
            }
          }
        }
      }
      if ((nodeStatChild->oddTopDist == 0xffffffff) || (nodeStatChild->oddBotDist == 0xffffffff)) {
        pathLength = 0xffffffff;
      }
      else {
        pathLength = nodeStatChild->oddTopDist + nodeStatChild->oddBotDist;
      }
      if ((nodeStatChild->evenTopDist == 0xffffffff) || (nodeStatChild->evenBotDist == 0xffffffff))
      {
        botDist = 0xffffffff;
      }
      else {
        botDist = nodeStatChild->evenTopDist + nodeStatChild->evenBotDist;
      }
      if (pathLength < local_88) {
        if (local_88 != 0xffffffff) {
          (&fp_local->_flags)[local_88] = (&fp_local->_flags)[local_88] + -1;
        }
        if (pathLength != 0xffffffff) {
          (&fp_local->_flags)[pathLength] = (&fp_local->_flags)[pathLength] + 1;
        }
        processingDone = pathLength;
      }
      if (botDist < (uint)processingDone) {
        if (processingDone != -1) {
          (&fp_local->_flags)[(uint)processingDone] = (&fp_local->_flags)[(uint)processingDone] + -1
          ;
        }
        if (botDist != 0xffffffff) {
          (&fp_local->_flags)[botDist] = (&fp_local->_flags)[botDist] + 1;
        }
      }
      node_local._4_4_ = 1;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int
CreateBotDist(
  DdNode * node /* current node */,
  st__table * pathTable /* path table with path lengths */,
  unsigned int * pathLengthArray /* array that stores number of nodes belonging to a particular path length. */,
  FILE *fp /* where to write messages */)
{
    DdNode *N, *Nv, *Nnv;
    DdNode *realChild;
    DdNode *child, *regChild;
    NodeDist_t *nodeStat, *nodeStatChild;
    unsigned int  oddLen, evenLen, pathLength;
    DdHalfWord botDist;
    int processingDone;

    if (Cudd_IsConstant(node))
        return(1);
    N = Cudd_Regular(node);
    /* each node has one table entry */
    /* update as you go down the min dist of each node from
       the root in each (odd and even) parity */
    if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
        fprintf(fp, "Something wrong, the entry doesn't exist\n");
        return(0);
    }

    /* compute length of odd parity distances */
    if ((nodeStat->oddTopDist != MAXSHORTINT) &&
        (nodeStat->oddBotDist != MAXSHORTINT))
        oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
    else
        oddLen = MAXSHORTINT;

    /* compute length of even parity distances */
    if (!((nodeStat->evenTopDist == MAXSHORTINT) ||
          (nodeStat->evenBotDist == MAXSHORTINT)))
        evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
    else
        evenLen = MAXSHORTINT;

    /* assign pathlength to minimum of the two */
    pathLength = (oddLen <= evenLen) ? oddLen : evenLen;

    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    /* process each child */
    processingDone = 0;
    while (processingDone != 2) {
        if (!processingDone) {
            child = Nv;
        } else {
            child = Nnv;
        }

        realChild = Cudd_NotCond(child, Cudd_IsComplement(node));
        regChild = Cudd_Regular(child);
        if (Cudd_IsConstant(realChild)) {
            /* Found a minterm; count parity and shortest distance
            ** from the constant.
            */
            if (Cudd_IsComplement(child))
                nodeStat->oddBotDist = 1;
            else
                nodeStat->evenBotDist = 1;
        } else {
            /* If node not in table, recur. */
            if (! st__lookup(pathTable, (const char *)regChild, (char **)&nodeStatChild)) {
                fprintf(fp, "Something wrong, node in table should have been created in top dist proc.\n");
                return(0);
            }

            if (nodeStatChild->oddBotDist == MAXSHORTINT) {
                if (nodeStatChild->evenBotDist == MAXSHORTINT) {
                    if (!CreateBotDist(realChild, pathTable, pathLengthArray, fp))
                        return(0);
                } else {
                    fprintf(fp, "Something wrong, both bot nodeStats should be there\n");
                    return(0);
                }
            }

            /* Update shortest distance from the constant depending on
            **  parity. */

            if (Cudd_IsComplement(child)) {
                /* If parity on the edge then add 1 to even distance
                ** of child to get odd parity distance and add 1 to
                ** odd distance of child to get even parity
                ** distance. Change distance of current node only if
                ** the calculated distance is less than existing
                ** distance. */
                if (nodeStatChild->oddBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->oddBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->evenBotDist > botDist )
                    nodeStat->evenBotDist = botDist;

                if (nodeStatChild->evenBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->evenBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->oddBotDist > botDist)
                    nodeStat->oddBotDist = botDist;

            } else {
                /* If parity on the edge then add 1 to even distance
                ** of child to get even parity distance and add 1 to
                ** odd distance of child to get odd parity distance.
                ** Change distance of current node only if the
                ** calculated distance is lesser than existing
                ** distance. */
                if (nodeStatChild->evenBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->evenBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->evenBotDist > botDist)
                    nodeStat->evenBotDist = botDist;

                if (nodeStatChild->oddBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->oddBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->oddBotDist > botDist)
                    nodeStat->oddBotDist = botDist;
            }
        } /* end of else (if not constant child ) */
        processingDone++;
    } /* end of while processing Nv, Nnv */

    /* Compute shortest path length on the fly. */
    if ((nodeStat->oddTopDist != MAXSHORTINT) &&
        (nodeStat->oddBotDist != MAXSHORTINT))
        oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
    else
        oddLen = MAXSHORTINT;

    if ((nodeStat->evenTopDist != MAXSHORTINT) &&
        (nodeStat->evenBotDist != MAXSHORTINT))
        evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
    else
        evenLen = MAXSHORTINT;

    /* Update path length array that has number of nodes of a particular
    ** path length. */
    if (oddLen < pathLength ) {
        if (pathLength != MAXSHORTINT)
            pathLengthArray[pathLength]--;
        if (oddLen != MAXSHORTINT)
            pathLengthArray[oddLen]++;
        pathLength = oddLen;
    }
    if (evenLen < pathLength ) {
        if (pathLength != MAXSHORTINT)
            pathLengthArray[pathLength]--;
        if (evenLen != MAXSHORTINT)
            pathLengthArray[evenLen]++;
    }

    return(1);

}